

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O3

void ColorPhiWebs(VmFunction *function)

{
  VmBlock *pVVar1;
  uint color;
  VmInstruction *inst;
  
  function->nextColor = 0;
  for (pVVar1 = function->firstBlock; pVVar1 != (VmBlock *)0x0; pVVar1 = pVVar1->nextSibling) {
    for (inst = pVVar1->firstInstruction; inst != (VmInstruction *)0x0; inst = inst->nextSibling) {
      if ((inst->cmd == VM_INST_PHI) && (inst->color == 0)) {
        color = function->nextColor + 1;
        function->nextColor = color;
        ColorPhiWeb(inst,color);
      }
    }
  }
  return;
}

Assistant:

void ColorPhiWebs(VmFunction* function)
{
	function->nextColor = 0;

	for(VmBlock *block = function->firstBlock; block; block = block->nextSibling)
	{
		for(VmInstruction *inst = block->firstInstruction; inst; inst = inst->nextSibling)
		{
			if(inst->cmd == VM_INST_PHI && inst->color == 0)
				ColorPhiWeb(inst, ++function->nextColor);
		}
	}
}